

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void api_suite::api_string_output(void)

{
  undefined1 local_170 [8];
  string result;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [8];
  
  decoder.current.scan.string.segment_tail[0x1f] = (const_pointer)0x226168706c6122;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<8ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [8])(decoder.current.scan.string.segment_tail + 0x1f));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  result.field_2._12_4_ = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x79,"void api_suite::api_string_output()",local_148,
             (undefined1 *)((long)&result.field_2 + 0xc));
  std::__cxx11::string::string((string *)local_170);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            ((basic_decoder<char> *)local_140,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7c,"void api_suite::api_string_output()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,"alpha")
  ;
  std::__cxx11::string::~string((string *)local_170);
  return;
}

Assistant:

void api_string_output()
{
    const char input[] = "\"alpha\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    std::string result;
    TRIAL_PROTOCOL_TEST_NO_THROW(decoder.string_value<std::string>(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
}